

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.hpp
# Opt level: O0

void __thiscall
CLI::IncorrectConstruction::IncorrectConstruction
          (IncorrectConstruction *this,string *IncorrectConstruction,string *msg,ExitCodes exit_code
          )

{
  string local_68;
  string local_48;
  ExitCodes local_24;
  string *psStack_20;
  ExitCodes exit_code_local;
  string *msg_local;
  string *IncorrectConstruction_local;
  IncorrectConstruction *this_local;
  
  local_24 = exit_code;
  psStack_20 = msg;
  msg_local = IncorrectConstruction;
  IncorrectConstruction_local = (string *)this;
  ::std::__cxx11::string::string((string *)&local_48,(string *)IncorrectConstruction);
  ::std::__cxx11::string::string((string *)&local_68,(string *)msg);
  ConstructionError::ConstructionError(&this->super_ConstructionError,&local_48,&local_68,local_24);
  ::std::__cxx11::string::~string((string *)&local_68);
  ::std::__cxx11::string::~string((string *)&local_48);
  *(undefined ***)&(this->super_ConstructionError).super_Error =
       &PTR__IncorrectConstruction_0013e920;
  return;
}

Assistant:

static IncorrectConstruction PositionalFlag(std::string name) {
        return IncorrectConstruction(name + ": Flags cannot be positional");
    }